

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc.cpp
# Opt level: O1

particle * __thiscall
spatial_region::bear_particle
          (spatial_region *this,double cmr,vector3d *position,vector3d *direction,double g,
          double chi,double q)

{
  double dVar1;
  particle *ppVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  ppVar2 = new_particle(this);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = g;
  ppVar2->cmr = cmr;
  ppVar2->q = q;
  ppVar2->g = g;
  ppVar2->chi = chi;
  dVar3 = position->y;
  ppVar2->x = position->x;
  ppVar2->y = dVar3;
  ppVar2->z = position->z;
  if ((cmr != 0.0) || (NAN(cmr))) {
    auVar11 = vfmadd213sd_fma(auVar11,auVar11,ZEXT816(0xbff0000000000000));
    auVar6._8_8_ = 0;
    auVar6._0_8_ = direction->x;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = direction->y * direction->y;
    auVar6 = vfmadd231sd_fma(auVar10,auVar6,auVar6);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = direction->z;
    auVar6 = vfmadd213sd_fma(auVar7,auVar7,auVar6);
    auVar8._0_8_ = auVar11._0_8_ / auVar6._0_8_;
    auVar8._8_8_ = auVar11._8_8_;
    if (auVar8._0_8_ < 0.0) {
      dVar3 = sqrt(auVar8._0_8_);
    }
    else {
      auVar11 = vsqrtsd_avx(auVar8,auVar8);
      dVar3 = auVar11._0_8_;
    }
  }
  else {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = direction->x;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = direction->y * direction->y;
    auVar11 = vfmadd231sd_fma(auVar9,auVar4,auVar4);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = direction->z;
    auVar11 = vfmadd213sd_fma(auVar5,auVar5,auVar11);
    if (auVar11._0_8_ < 0.0) {
      dVar3 = sqrt(auVar11._0_8_);
    }
    else {
      auVar11 = vsqrtsd_avx(auVar11,auVar11);
      dVar3 = auVar11._0_8_;
    }
    dVar3 = g / dVar3;
  }
  dVar1 = direction->y;
  ppVar2->ux = dVar3 * direction->x;
  ppVar2->uy = dVar3 * dVar1;
  ppVar2->uz = dVar3 * direction->z;
  ppVar2->trn = 0;
  return ppVar2;
}

Assistant:

particle* spatial_region::bear_particle(double cmr, vector3d& position, vector3d& direction, double g, double chi, double q)
{
    particle* p;
    double a;
    p = new_particle();
    p->cmr = cmr;
    p->q = q;
    p->g = g;
    p->chi = chi;
    p->x = position.x;
    p->y = position.y;
    p->z = position.z;
    if (cmr==0)
        a = g/sqrt(direction.x*direction.x + direction.y*direction.y + direction.z*direction.z);
    else
        a = sqrt((g*g-1)/(direction.x*direction.x + direction.y*direction.y + direction.z*direction.z));
    p->ux = a*direction.x;
    p->uy = a*direction.y;
    p->uz = a*direction.z;
    p->trn = 0;
    return p;
}